

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_interpolate_strong_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_Fixed FVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  FT_Int32 FVar5;
  long a_;
  FT_Long FVar6;
  FT_Pos delta;
  PSH_Hint_conflict hint;
  PSH_Point_conflict point;
  FT_UInt count;
  FT_Fixed scale;
  PSH_Dimension dim;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  FVar1 = glyph->globals->dimension[dimension].scale_mult;
  hint = (PSH_Hint_conflict)glyph->points;
  for (point._4_4_ = glyph->num_points; point._4_4_ != 0; point._4_4_ = point._4_4_ - 1) {
    piVar2 = *(int **)&hint->order;
    if (piVar2 != (int *)0x0) {
      if ((*(uint *)&hint->field_0x1c & 0x200) == 0) {
        if ((*(uint *)&hint->field_0x1c & 0x400) == 0) {
          a_ = *(long *)(hint + 1) - (long)*piVar2;
          FVar5 = (FT_Int32)FVar1;
          if (a_ < 1) {
            lVar3 = *(long *)(piVar2 + 2);
            FVar5 = FT_MulFix_x86_64((FT_Int32)a_,FVar5);
            hint[1].cur_len = lVar3 + FVar5;
          }
          else if (a_ < piVar2[1]) {
            lVar3 = *(long *)(piVar2 + 2);
            FVar6 = FT_MulDiv(a_,*(FT_Long *)(piVar2 + 4),(long)piVar2[1]);
            hint[1].cur_len = lVar3 + FVar6;
          }
          else {
            lVar3 = *(long *)(piVar2 + 2);
            lVar4 = *(long *)(piVar2 + 4);
            FVar5 = FT_MulFix_x86_64((FT_Int32)a_ - piVar2[1],FVar5);
            hint[1].cur_len = lVar3 + lVar4 + (long)FVar5;
          }
        }
        else {
          hint[1].cur_len = *(long *)(piVar2 + 2) + *(long *)(piVar2 + 4);
        }
      }
      else {
        hint[1].cur_len = *(FT_Pos *)(piVar2 + 2);
      }
      *(uint *)&hint->field_0x1c = *(uint *)&hint->field_0x1c | 0x20;
    }
    hint = (PSH_Hint_conflict)&hint[1].flags;
  }
  return;
}

Assistant:

static void
  psh_glyph_interpolate_strong_points( PSH_Glyph  glyph,
                                       FT_Int     dimension )
  {
    PSH_Dimension  dim   = &glyph->globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;

    FT_UInt        count = glyph->num_points;
    PSH_Point      point = glyph->points;


    for ( ; count > 0; count--, point++ )
    {
      PSH_Hint  hint = point->hint;


      if ( hint )
      {
        FT_Pos  delta;


        if ( psh_point_is_edge_min( point ) )
          point->cur_u = hint->cur_pos;

        else if ( psh_point_is_edge_max( point ) )
          point->cur_u = hint->cur_pos + hint->cur_len;

        else
        {
          delta = point->org_u - hint->org_pos;

          if ( delta <= 0 )
            point->cur_u = hint->cur_pos + FT_MulFix( delta, scale );

          else if ( delta >= hint->org_len )
            point->cur_u = hint->cur_pos + hint->cur_len +
                             FT_MulFix( delta - hint->org_len, scale );

          else /* hint->org_len > 0 */
            point->cur_u = hint->cur_pos +
                             FT_MulDiv( delta, hint->cur_len,
                                        hint->org_len );
        }
        psh_point_set_fitted( point );
      }
    }
  }